

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intrusive_list.cpp
# Opt level: O2

void __thiscall
IntrusiveList_IteratorIncrement_Test::IntrusiveList_IteratorIncrement_Test
          (IntrusiveList_IteratorIncrement_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0018abb8;
  return;
}

Assistant:

TEST (IntrusiveList, IteratorIncrement) {
    value member{7};
    pstore::broker::intrusive_list<value> v;
    v.insert_before (&member, v.tail ());

    pstore::broker::intrusive_list<value>::iterator begin = v.begin ();
    pstore::broker::intrusive_list<value>::iterator it = begin;
    ++it;
    pstore::broker::intrusive_list<value>::iterator it2 = begin;
    it2++;
    EXPECT_EQ (it, it2);

    --it;
    it2--;
    EXPECT_EQ (it, it2);
    EXPECT_EQ (it, begin);
}